

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O3

bool __thiscall Clasp::Solver::decideNextBranch(Solver *this,double f)

{
  uint uVar1;
  pointer puVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  fd_set *in_RCX;
  uint uVar6;
  fd_set *in_RDX;
  ulong uVar7;
  fd_set *in_R8;
  timeval *in_R9;
  Literal local_c;
  
  if (0.0 < f) {
    uVar5 = (this->rng).seed_ * 0x343fd + 0x269ec3;
    in_RCX = (fd_set *)(ulong)uVar5;
    (this->rng).seed_ = uVar5;
    if ((double)(uVar5 >> 0x10 & 0x7fff) * 3.0517578125e-05 < f) {
      uVar1 = (this->assign_).assign_.ebo_.size;
      uVar6 = (this->assign_).trail.ebo_.size + (this->assign_).elims_ + 1;
      in_RDX = (fd_set *)(ulong)uVar6;
      if (uVar1 != uVar6) {
        uVar5 = uVar5 * 0x343fd + 0x269ec3;
        (this->rng).seed_ = uVar5;
        uVar7 = (ulong)((double)uVar1 * (double)(uVar5 >> 0x10 & 0x7fff) * 3.0517578125e-05);
        puVar2 = (this->assign_).assign_.ebo_.buf;
        if ((puVar2[uVar7 & 0xffffffff] & 3) == 0) {
          uVar7 = uVar7 & 0xffffffff;
        }
        else {
          do {
            iVar4 = (int)uVar7;
            uVar7 = (ulong)(iVar4 + 1);
            if (iVar4 == uVar1 - 1) {
              uVar7 = 1;
            }
          } while ((puVar2[uVar7] & 3) != 0);
        }
        local_c = DecisionHeuristic::selectLiteral(this,(Var)uVar7,0);
        bVar3 = assume(this,&local_c);
        return bVar3;
      }
    }
  }
  iVar4 = DecisionHeuristic::select
                    ((DecisionHeuristic *)((this->heuristic_).ptr_ & 0xfffffffffffffffe),(int)this,
                     in_RDX,in_RCX,in_R8,in_R9);
  return SUB41(iVar4,0);
}

Assistant:

bool Solver::decideNextBranch(double f) {
	if (f <= 0.0 || rng.drand() >= f || numFreeVars() == 0) {
		return heuristic_->select(*this);
	}
	// select randomly
	Literal choice;
	uint32 maxVar = numVars() + 1;
	for (uint32 v = rng.irand(maxVar);;) {
		if (value(v) == value_free) {
			choice    = heuristic_->selectLiteral(*this, v, 0);
			break;
		}
		if (++v == maxVar) { v = 1; }
	}
	return assume(choice);
}